

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void dwt_encode(opj_tcd_tilecomp_t *tilec)

{
  int *piVar1;
  opj_tcd_resolution_t *poVar2;
  int dn;
  int iVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  int cas;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  int sn;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  
  lVar15 = (long)tilec->x1;
  lVar4 = (long)tilec->x0;
  uVar9 = (long)tilec->numresolutions - 1;
  piVar1 = tilec->data;
  uVar13 = 0;
  uVar16 = 0;
  if (0 < (int)uVar9) {
    uVar16 = uVar9 & 0xffffffff;
  }
  for (; uVar13 != uVar16; uVar13 = uVar13 + 1) {
    poVar2 = tilec->resolutions;
    lVar5 = uVar9 - uVar13;
    iVar11 = poVar2[lVar5].x0;
    uVar19 = (long)poVar2[lVar5].x1 - (long)iVar11;
    uVar14 = (long)poVar2[lVar5].y1 - (long)poVar2[lVar5].y0;
    iVar3 = poVar2[lVar5 + -1].x0;
    iVar18 = poVar2[lVar5 + -1].x1;
    sn = poVar2[lVar5 + -1].y1 - poVar2[lVar5 + -1].y0;
    cas = poVar2[lVar5].y0 % 2;
    dn = (int)uVar14 - sn;
    piVar6 = (int *)malloc(uVar14 * 4);
    uVar17 = 0;
    if (0 < (int)uVar14) {
      uVar17 = uVar14 & 0xffffffff;
    }
    uVar14 = 0;
    if (0 < (int)uVar19) {
      uVar14 = uVar19 & 0xffffffff;
    }
    piVar8 = piVar1;
    for (uVar12 = 0; uVar12 != uVar14; uVar12 = uVar12 + 1) {
      piVar7 = piVar8;
      for (uVar10 = 0; uVar17 != uVar10; uVar10 = uVar10 + 1) {
        piVar6[uVar10] = *piVar7;
        piVar7 = piVar7 + (lVar15 - lVar4);
      }
      dwt_encode_1(piVar6,dn,sn,cas);
      dwt_deinterleave_v(piVar6,piVar1 + uVar12,dn,sn,(int)(lVar15 - lVar4),cas);
      piVar8 = piVar8 + 1;
    }
    iVar18 = iVar18 - iVar3;
    iVar11 = iVar11 % 2;
    free(piVar6);
    iVar3 = (int)uVar19 - iVar18;
    piVar8 = (int *)malloc(uVar19 * 4);
    piVar6 = piVar1;
    for (uVar19 = 0; uVar19 != uVar17; uVar19 = uVar19 + 1) {
      for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
        piVar8[uVar12] = piVar6[uVar12];
      }
      dwt_encode_1(piVar8,iVar3,iVar18,iVar11);
      dwt_deinterleave_h(piVar8,piVar1 + uVar19 * (lVar15 - lVar4),iVar3,iVar18,iVar11);
      piVar6 = piVar6 + (lVar15 - lVar4);
    }
    free(piVar8);
  }
  return;
}

Assistant:

void dwt_encode(opj_tcd_tilecomp_t * tilec) {
	int i, j, k;
	int *a = NULL;
	int *aj = NULL;
	int *bj = NULL;
	int w, l;
	
	w = tilec->x1-tilec->x0;
	l = tilec->numresolutions-1;
	a = tilec->data;
	
	for (i = 0; i < l; i++) {
		int rw;			/* width of the resolution level computed                                                           */
		int rh;			/* height of the resolution level computed                                                          */
		int rw1;		/* width of the resolution level once lower than computed one                                       */
		int rh1;		/* height of the resolution level once lower than computed one                                      */
		int cas_col;	/* 0 = non inversion on horizontal filtering 1 = inversion between low-pass and high-pass filtering */
		int cas_row;	/* 0 = non inversion on vertical filtering 1 = inversion between low-pass and high-pass filtering   */
		int dn, sn;
		
		rw = tilec->resolutions[l - i].x1 - tilec->resolutions[l - i].x0;
		rh = tilec->resolutions[l - i].y1 - tilec->resolutions[l - i].y0;
		rw1= tilec->resolutions[l - i - 1].x1 - tilec->resolutions[l - i - 1].x0;
		rh1= tilec->resolutions[l - i - 1].y1 - tilec->resolutions[l - i - 1].y0;
		
		cas_row = tilec->resolutions[l - i].x0 % 2;
		cas_col = tilec->resolutions[l - i].y0 % 2;
        
		sn = rh1;
		dn = rh - rh1;
		bj = (int*)opj_malloc(rh * sizeof(int));
		for (j = 0; j < rw; j++) {
			aj = a + j;
			for (k = 0; k < rh; k++)  bj[k] = aj[k*w];
			dwt_encode_1(bj, dn, sn, cas_col);
			dwt_deinterleave_v(bj, aj, dn, sn, w, cas_col);
		}
		opj_free(bj);
		
		sn = rw1;
		dn = rw - rw1;
		bj = (int*)opj_malloc(rw * sizeof(int));
		for (j = 0; j < rh; j++) {
			aj = a + j * w;
			for (k = 0; k < rw; k++)  bj[k] = aj[k];
			dwt_encode_1(bj, dn, sn, cas_row);
			dwt_deinterleave_h(bj, aj, dn, sn, cas_row);
		}
		opj_free(bj);
	}
}